

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O1

void initstreams(string *inFile,string *outFile)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FILE *pFVar7;
  undefined8 *puVar8;
  long *plVar9;
  uint uVar10;
  ulong *puVar11;
  char *extraout_RDX;
  ulong uVar12;
  char *pcVar13;
  undefined8 uVar14;
  string *psVar15;
  uint uVar16;
  ulong *puStack_1f0;
  long lStack_1e8;
  ulong uStack_1e0;
  undefined8 uStack_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b0;
  ulong *puStack_190;
  long lStack_188;
  ulong auStack_180 [2];
  ulong *puStack_170;
  long lStack_168;
  ulong uStack_160;
  long lStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_150;
  char *pcStack_130;
  char *pcStack_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_120;
  undefined1 auStack_100 [184];
  string *psStack_48;
  
  if (outFile->_M_string_length == 0) {
LAB_00103427:
    if (inFile->_M_string_length == 0) {
LAB_0010344c:
      freopen((char *)0x0,"a+b",_stdout);
      freopen((char *)0x0,"rb",_stdin);
      return;
    }
    pcVar13 = "rb";
    pFVar7 = freopen((inFile->_M_dataplus)._M_p,"rb",_stdin);
    if (pFVar7 != (FILE *)0x0) goto LAB_0010344c;
  }
  else {
    pcVar13 = "wb";
    pFVar7 = freopen((outFile->_M_dataplus)._M_p,"wb",_stdout);
    if (pFVar7 != (FILE *)0x0) goto LAB_00103427;
    initstreams();
  }
  psVar15 = inFile;
  initstreams();
  paVar2 = &bStack_1d0.field_2;
  bStack_1d0._M_dataplus._M_p = (pointer)paVar2;
  pcStack_128 = pcVar13;
  psStack_48 = inFile;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_1d0,"/\\","");
  std::__cxx11::string::find_last_of
            ((char *)psVar15,(ulong)bStack_1d0._M_dataplus._M_p,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bStack_150,(ulong)psVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(bStack_1d0._M_dataplus._M_p);
  }
  puStack_1f0 = &uStack_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_1f0,"/\\","");
  std::__cxx11::string::find_last_of((char *)&bStack_150,(ulong)puStack_1f0,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bStack_1b0,(ulong)&bStack_150);
  remove_extension<std::__cxx11::string>(&bStack_1d0,&bStack_1b0);
  std::__cxx11::string::operator=((string *)&bStack_150,(string *)&bStack_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1d0._M_dataplus._M_p != paVar2) {
    operator_delete(bStack_1d0._M_dataplus._M_p);
  }
  paVar3 = &bStack_1b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1b0._M_dataplus._M_p != paVar3) {
    operator_delete(bStack_1b0._M_dataplus._M_p);
  }
  if (puStack_1f0 != &uStack_1e0) {
    operator_delete(puStack_1f0);
  }
  bStack_1b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&bStack_1b0,bStack_150._M_dataplus._M_p,
             bStack_150._M_dataplus._M_p + bStack_150._M_string_length);
  std::__cxx11::string::append((char *)&bStack_1b0);
  uVar6 = getpid();
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar16 = 1;
  if (9 < uVar4) {
    uVar12 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_001036b0;
      }
      if (uVar10 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_001036b0;
      }
      if (uVar10 < 10000) goto LAB_001036b0;
      uVar12 = uVar12 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar10);
    uVar16 = uVar16 + 1;
  }
LAB_001036b0:
  puStack_1f0 = &uStack_1e0;
  std::__cxx11::string::_M_construct((ulong)&puStack_1f0,(char)uVar16 - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)puStack_1f0),uVar16,uVar4);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1b0._M_dataplus._M_p != paVar3) {
    uVar14 = bStack_1b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < lStack_1e8 + bStack_1b0._M_string_length) {
    uVar12 = 0xf;
    if (puStack_1f0 != &uStack_1e0) {
      uVar12 = uStack_1e0;
    }
    if (uVar12 < lStack_1e8 + bStack_1b0._M_string_length) goto LAB_0010371f;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&puStack_1f0,0,(char *)0x0,(ulong)bStack_1b0._M_dataplus._M_p);
  }
  else {
LAB_0010371f:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&bStack_1b0,(ulong)puStack_1f0);
  }
  psVar1 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    bStack_1d0.field_2._M_allocated_capacity = *psVar1;
    bStack_1d0.field_2._8_8_ = puVar8[3];
    bStack_1d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    bStack_1d0.field_2._M_allocated_capacity = *psVar1;
    bStack_1d0._M_dataplus._M_p = (pointer)*puVar8;
  }
  bStack_1d0._M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (puStack_1f0 != &uStack_1e0) {
    operator_delete(puStack_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1b0._M_dataplus._M_p != paVar3) {
    operator_delete(bStack_1b0._M_dataplus._M_p);
  }
  std::operator+(&bStack_120,"log/",&bStack_150);
  plVar9 = (long *)std::__cxx11::string::append((char *)&bStack_120);
  puVar11 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar11) {
    uStack_160 = *puVar11;
    lStack_158 = plVar9[3];
    puStack_170 = &uStack_160;
  }
  else {
    uStack_160 = *puVar11;
    puStack_170 = (ulong *)*plVar9;
  }
  lStack_168 = plVar9[1];
  *plVar9 = (long)puVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar6 = getpid();
  uVar4 = -uVar6;
  if (0 < (int)uVar6) {
    uVar4 = uVar6;
  }
  uVar16 = 1;
  if (9 < uVar4) {
    uVar12 = (ulong)uVar4;
    uVar5 = 4;
    do {
      uVar16 = uVar5;
      uVar10 = (uint)uVar12;
      if (uVar10 < 100) {
        uVar16 = uVar16 - 2;
        goto LAB_00103888;
      }
      if (uVar10 < 1000) {
        uVar16 = uVar16 - 1;
        goto LAB_00103888;
      }
      if (uVar10 < 10000) goto LAB_00103888;
      uVar12 = uVar12 / 10000;
      uVar5 = uVar16 + 4;
    } while (99999 < uVar10);
    uVar16 = uVar16 + 1;
  }
LAB_00103888:
  puStack_190 = auStack_180;
  pcStack_130 = extraout_RDX;
  std::__cxx11::string::_M_construct((ulong)&puStack_190,(char)uVar16 - (char)((int)uVar6 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar6 >> 0x1f) + (long)puStack_190),uVar16,uVar4);
  uVar12 = 0xf;
  if (puStack_170 != &uStack_160) {
    uVar12 = uStack_160;
  }
  if (uVar12 < (ulong)(lStack_188 + lStack_168)) {
    uVar12 = 0xf;
    if (puStack_190 != auStack_180) {
      uVar12 = auStack_180[0];
    }
    if ((ulong)(lStack_188 + lStack_168) <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&puStack_190,0,(char *)0x0,(ulong)puStack_170);
      goto LAB_0010392f;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&puStack_170,(ulong)puStack_190);
LAB_0010392f:
  puVar11 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar11) {
    uStack_1e0 = *puVar11;
    uStack_1d8 = puVar8[3];
    puStack_1f0 = &uStack_1e0;
  }
  else {
    uStack_1e0 = *puVar11;
    puStack_1f0 = (ulong *)*puVar8;
  }
  lStack_1e8 = puVar8[1];
  *puVar8 = puVar11;
  puVar8[1] = 0;
  *(undefined1 *)puVar11 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&puStack_1f0);
  plVar9 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar9) {
    bStack_1b0.field_2._M_allocated_capacity = *plVar9;
    bStack_1b0.field_2._8_8_ = puVar8[3];
    bStack_1b0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    bStack_1b0.field_2._M_allocated_capacity = *plVar9;
    bStack_1b0._M_dataplus._M_p = (pointer)*puVar8;
  }
  bStack_1b0._M_string_length = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&bStack_150,(string *)&bStack_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1b0._M_dataplus._M_p != paVar3) {
    operator_delete(bStack_1b0._M_dataplus._M_p);
  }
  if (puStack_1f0 != &uStack_1e0) {
    operator_delete(puStack_1f0);
  }
  if (puStack_190 != auStack_180) {
    operator_delete(puStack_190);
  }
  if (puStack_170 != &uStack_160) {
    operator_delete(puStack_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_120._M_dataplus._M_p != &bStack_120.field_2) {
    operator_delete(bStack_120._M_dataplus._M_p);
  }
  pFVar7 = fopen(bStack_150._M_dataplus._M_p,"a");
  if (pFVar7 != (FILE *)0x0) {
    fprintf(pFVar7,"%s:%s:",*(undefined8 *)pcStack_128,bStack_1d0._M_dataplus._M_p);
    bStack_1b0.field_2._M_allocated_capacity = (size_type)auStack_100;
    bStack_1b0._M_string_length = (size_type)&stack0xfffffffffffffff0;
    bStack_1b0._M_dataplus._M_p = (pointer)0x3000000018;
    vfprintf(pFVar7,pcStack_130,&bStack_1b0);
    fclose(pFVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_1d0._M_dataplus._M_p != &bStack_1d0.field_2) {
    operator_delete(bStack_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_150._M_dataplus._M_p != &bStack_150.field_2) {
    operator_delete(bStack_150._M_dataplus._M_p);
  }
  return;
}

Assistant:

inline void initstreams(std::string inFile="", std::string outFile="")
{

   if (outFile.length() > 0){
       if (freopen(outFile.c_str(), "wb", stdout) == NULL) {
		   fprintf(stderr, "%s: Error opening file %s\n", __func__, outFile.c_str());
           exit(-1);
        }
   }

   if (inFile.length() > 0){
        if (freopen(inFile.c_str(), "rb", stdin) == NULL) {
			fprintf(stderr, "%s: Error opening file %s\n", __func__, inFile.c_str());
            exit(-1);
         }
   }

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#elif __APPLE__
	freopen(NULL, "wb", stdout);
	freopen(NULL, "rb", stdin);
#elif __linux
	freopen(NULL, "a+b", stdout);
	freopen(NULL, "rb", stdin);
#endif

}